

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O3

void __thiscall
TPZFileEqnStorage<long_double>::~TPZFileEqnStorage(TPZFileEqnStorage<long_double> *this)

{
  ~TPZFileEqnStorage(this,&VTT);
  operator_delete(this,0xb8);
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::~TPZFileEqnStorage()
{
	remove(fFileName.c_str());
}